

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_utils_test.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6d1de::DataDictionaryUtilsTest_TestAddAllFields_Test::
~DataDictionaryUtilsTest_TestAddAllFields_Test(DataDictionaryUtilsTest_TestAddAllFields_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DataDictionaryUtilsTest, TestAddAllFields)
{
    ExtendableDataDictionary data_dictionary = ExtendableDataDictionary();
    data_dictionary.AddFieldDef(bid);
    data_dictionary.AddFieldDef(ask);
    std::vector<FieldDef> inter_vector = {bid_size, ask_size};
    DataDictionaryUtils::AddAllFields(data_dictionary, inter_vector);
    std::vector<FieldDef> actual = {bid, ask, bid_size, ask_size};
    ASSERT_TRUE(actual == data_dictionary.AllFieldDefs());
}